

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O2

void mean_double_suite::test_ctor(void)

{
  undefined8 local_38;
  undefined8 local_30;
  
  local_38 = 0;
  local_30 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x1e,"void mean_double_suite::test_ctor()",&local_38,&local_30);
  local_38 = 0;
  local_30 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("copy.mean()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x22,"void mean_double_suite::test_ctor()",&local_38,&local_30);
  local_38 = 0;
  local_30 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("mover.mean()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x26,"void mean_double_suite::test_ctor()",&local_38,&local_30);
  return;
}

Assistant:

void test_ctor()
{
    decay::moment<double> filter(one_over_eight);
    TRIAL_TEST_EQ(filter.mean(), 0.0);

    // Copy constructor
    decay::moment<double> copy(filter);
    TRIAL_TEST_EQ(copy.mean(), 0.0);

    // Move constructor
    decay::moment<double> mover(std::move(copy));
    TRIAL_TEST_EQ(mover.mean(), 0.0);
}